

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

void __thiscall minibag::TimePublisher::TimePublisher(TimePublisher *this)

{
  _Base_ptr *pp_Var1;
  Publisher local_78;
  element_type local_68;
  undefined7 uStack_67;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  this->time_scale_ = 1.0;
  local_78.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (element_type)0x0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_68;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  miniros::NodeHandle::NodeHandle(&this->node_handle_,(string *)&local_78,(map *)&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  if (local_78.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != &local_68) {
    operator_delete(local_78.impl_.
                    super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(uStack_67,local_68) + 1);
  }
  (this->wc_horizon_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)0x0;
  (this->horizon_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  (this->wall_step_).super_DurationBase<miniros::WallDuration> =
       (DurationBase<miniros::WallDuration>)0x0;
  (this->next_pub_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)0x0;
  (this->time_pub_).impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->time_pub_).impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  this->publish_frequency_ = -1.0;
  this->do_publish_ = false;
  miniros::DurationBase<miniros::WallDuration>::fromSec(-1.0);
  pp_Var1 = &local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_58._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"clock","");
  miniros::NodeHandle::advertise<rosgraph_msgs::Clock_<std::allocator<void>>>
            ((NodeHandle *)&local_78,(string *)&this->node_handle_,(uint32_t)&local_58,true);
  (this->time_pub_).impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_78.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->time_pub_).impl_.
              super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_78.impl_.
              super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  miniros::Publisher::~Publisher(&local_78);
  if ((_Base_ptr *)local_58._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_58._M_impl._0_8_,
                    (ulong)((long)&(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  return;
}

Assistant:

TimePublisher::TimePublisher() : time_scale_(1.0)
{
  setPublishFrequency(-1.0);
  time_pub_ = node_handle_.advertise<rosgraph_msgs::Clock>("clock",1);
}